

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_variance.c
# Opt level: O3

void av1_vaq_frame_setup(AV1_COMP *cpi)

{
  segmentation *seg;
  double dVar1;
  int qindex;
  RefCntBuffer *pRVar2;
  int iVar3;
  ulong uVar4;
  int seg_data;
  uint uVar5;
  uint uVar6;
  double *pdVar7;
  long lVar8;
  bool bVar9;
  
  pRVar2 = (cpi->common).prev_frame;
  uVar4 = 0;
  if (pRVar2 == (RefCntBuffer *)0x0) {
    bVar9 = false;
  }
  else {
    bVar9 = true;
    if ((cpi->common).width == pRVar2->width) {
      bVar9 = (cpi->common).height != pRVar2->height;
    }
  }
  seg = &(cpi->common).seg;
  uVar5 = (uint)((cpi->twopass_frame).mb_av_energy + -2.0);
  uVar6 = 7;
  if ((int)uVar5 < 7) {
    uVar6 = uVar5;
  }
  if (0 < (int)uVar6) {
    uVar4 = (ulong)uVar6;
  }
  if (!bVar9) {
    qindex = (cpi->common).quant_params.base_qindex;
    pdVar7 = rate_ratio;
    dVar1 = rate_ratio[uVar4];
    if ((((((cpi->common).current_frame.frame_type & 0xfd) == 0) ||
         ((cpi->common).features.error_resilient_mode != false)) ||
        ((cpi->refresh_frame).alt_ref_frame != false)) ||
       (((cpi->refresh_frame).golden_frame == true && ((cpi->rc).is_src_frame_alt_ref == 0)))) {
      cpi->vaq_refresh = 1;
      av1_enable_segmentation(seg);
      av1_clearall_segfeatures(seg);
      lVar8 = 0;
      do {
        iVar3 = av1_compute_qdelta_by_rate
                          (cpi,(cpi->common).current_frame.frame_type,qindex,*pdVar7 / dVar1);
        seg_data = iVar3;
        if (qindex + iVar3 == 0) {
          seg_data = 1 - qindex;
        }
        if (qindex == 0) {
          seg_data = iVar3;
        }
        av1_set_segdata(seg,(int)lVar8,'\0',seg_data);
        av1_enable_segfeature(seg,(int)lVar8,'\0');
        lVar8 = lVar8 + 1;
        pdVar7 = pdVar7 + 1;
      } while (lVar8 != 8);
    }
    return;
  }
  memset((cpi->enc_seg).map,0,
         (long)(cpi->common).mi_params.mi_cols * (long)(cpi->common).mi_params.mi_rows);
  av1_clearall_segfeatures(seg);
  av1_disable_segmentation(seg);
  return;
}

Assistant:

void av1_vaq_frame_setup(AV1_COMP *cpi) {
  AV1_COMMON *cm = &cpi->common;
  const RefreshFrameInfo *const refresh_frame = &cpi->refresh_frame;
  const int base_qindex = cm->quant_params.base_qindex;
  struct segmentation *seg = &cm->seg;
  int i;

  int resolution_change =
      cm->prev_frame && (cm->width != cm->prev_frame->width ||
                         cm->height != cm->prev_frame->height);
  int avg_energy = (int)(cpi->twopass_frame.mb_av_energy - 2);
  double avg_ratio;
  if (avg_energy > 7) avg_energy = 7;
  if (avg_energy < 0) avg_energy = 0;
  avg_ratio = rate_ratio[avg_energy];

  if (resolution_change) {
    memset(cpi->enc_seg.map, 0, cm->mi_params.mi_rows * cm->mi_params.mi_cols);
    av1_clearall_segfeatures(seg);
    av1_disable_segmentation(seg);
    return;
  }
  if (frame_is_intra_only(cm) || cm->features.error_resilient_mode ||
      refresh_frame->alt_ref_frame ||
      (refresh_frame->golden_frame && !cpi->rc.is_src_frame_alt_ref)) {
    cpi->vaq_refresh = 1;

    av1_enable_segmentation(seg);
    av1_clearall_segfeatures(seg);

    for (i = 0; i < MAX_SEGMENTS; ++i) {
      // Set up avg segment id to be 1.0 and adjust the other segments around
      // it.
      int qindex_delta =
          av1_compute_qdelta_by_rate(cpi, cm->current_frame.frame_type,
                                     base_qindex, rate_ratio[i] / avg_ratio);

      // We don't allow qindex 0 in a segment if the base value is not 0.
      // Q index 0 (lossless) implies 4x4 encoding only and in AQ mode a segment
      // Q delta is sometimes applied without going back around the rd loop.
      // This could lead to an illegal combination of partition size and q.
      if ((base_qindex != 0) && ((base_qindex + qindex_delta) == 0)) {
        qindex_delta = -base_qindex + 1;
      }

      av1_set_segdata(seg, i, SEG_LVL_ALT_Q, qindex_delta);
      av1_enable_segfeature(seg, i, SEG_LVL_ALT_Q);
    }
  }
}